

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::initStyleOption(QLineEdit *this,QStyleOptionFrame *option)

{
  long lVar1;
  bool bVar2;
  FrameFeature flags;
  QLineEditPrivate *this_00;
  QStyle *pQVar3;
  QWidget *in_RSI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QLineEditPrivate *d;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  QStyleOption *this_01;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QWidget *)0x0) {
    this_01 = in_RDI;
    this_00 = d_func((QLineEdit *)0x5c35a1);
    QStyleOption::initFrom(this_01,in_RSI);
    QVar4 = QWidget::contentsRect((QWidget *)this_00);
    local_18 = QVar4._0_8_;
    *(undefined8 *)&in_RSI->super_QPaintDevice = local_18;
    local_10 = QVar4._8_8_;
    *(undefined8 *)&in_RSI->field_0x18 = local_10;
    if ((this_00->field_0x27c & 1) == 0) {
      flags = None;
    }
    else {
      pQVar3 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      flags = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,5,in_RSI,in_RDI);
    }
    *(FrameFeature *)&in_RSI[1].field_0x18 = flags;
    *(undefined4 *)&in_RSI[1].field_0x1c = 0;
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Sunken);
    bVar2 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)this_00->control);
    if (bVar2) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_ReadOnly);
    }
    QFlags<QStyleOptionFrame::FrameFeature>::QFlags
              ((QFlags<QStyleOptionFrame::FrameFeature> *)in_RDI,flags);
    *(undefined4 *)&in_RSI[1].data = local_1c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::initStyleOption(QStyleOptionFrame *option) const
{
    if (!option)
        return;

    Q_D(const QLineEdit);
    option->initFrom(this);
    option->rect = contentsRect();
    option->lineWidth = d->frame ? style()->pixelMetric(QStyle::PM_DefaultFrameWidth, option, this)
                                 : 0;
    option->midLineWidth = 0;
    option->state |= QStyle::State_Sunken;
    if (d->control->isReadOnly())
        option->state |= QStyle::State_ReadOnly;
#ifdef QT_KEYPAD_NAVIGATION
    if (hasEditFocus())
        option->state |= QStyle::State_HasEditFocus;
#endif
    option->features = QStyleOptionFrame::None;
}